

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopGroup.cpp
# Opt level: O0

shared_ptr<Liby::TcpServer> __thiscall
Liby::EventLoopGroup::creatTcpServer(EventLoopGroup *this,string *host,string *service)

{
  bool bVar1;
  Logger *this_00;
  reference pvVar2;
  element_type *this_01;
  element_type *peVar3;
  string *in_RCX;
  int __n;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  int __fd;
  double __x;
  shared_ptr<Liby::TcpServer> sVar4;
  shared_ptr<Liby::Socket> local_80;
  undefined1 local_69;
  char *err;
  SockPtr sockPtr;
  undefined1 local_40 [8];
  list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_> eps;
  string *service_local;
  string *host_local;
  EventLoopGroup *this_local;
  shared_ptr<Liby::TcpServer> *tcpServer;
  
  Resolver::resolve((list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_> *)local_40,service,in_RCX
                   );
  bVar1 = std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>::empty
                    ((list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_> *)local_40);
  if (bVar1) {
    this_00 = Logger::getLogger();
    Logger::log(this_00,__x);
    std::shared_ptr<Liby::TcpServer>::shared_ptr((shared_ptr<Liby::TcpServer> *)this,(nullptr_t)0x0)
    ;
    sockPtr.super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 1
    ;
  }
  else {
    pvVar2 = std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>::front
                       ((list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_> *)local_40);
    __fd = (int)pvVar2;
    std::make_shared<Liby::Socket,Liby::Endpoint&>((Endpoint *)&err);
    this_01 = std::__shared_ptr_access<Liby::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<Liby::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&err);
    Socket::listen(this_01,__fd,__n);
    local_69 = 0;
    std::vector<Liby::EventLoop_*,_std::allocator<Liby::EventLoop_*>_>::operator[]
              ((vector<Liby::EventLoop_*,_std::allocator<Liby::EventLoop_*>_> *)(host + 3),0);
    std::make_shared<Liby::TcpServer,Liby::EventLoop*&>((EventLoop **)this);
    peVar3 = std::__shared_ptr_access<Liby::TcpServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Liby::TcpServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    std::shared_ptr<Liby::Socket>::shared_ptr(&local_80,(shared_ptr<Liby::Socket> *)&err);
    TcpServer::setServerSocket(peVar3,&local_80);
    std::shared_ptr<Liby::Socket>::~shared_ptr(&local_80);
    peVar3 = std::__shared_ptr_access<Liby::TcpServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Liby::TcpServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    TcpServer::start(peVar3);
    sockPtr.super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 1
    ;
    local_69 = 1;
    std::shared_ptr<Liby::Socket>::~shared_ptr((shared_ptr<Liby::Socket> *)&err);
  }
  std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>::~list
            ((list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_> *)local_40);
  sVar4.super___shared_ptr<Liby::TcpServer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar4.super___shared_ptr<Liby::TcpServer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<Liby::TcpServer>)
         sVar4.super___shared_ptr<Liby::TcpServer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<TcpServer>
EventLoopGroup::creatTcpServer(const std::string &host,
                               const std::string &service) {
    auto eps = Resolver::resolve(host, service);
    if (eps.empty()) {
        error("host or service unavaiable");
        return nullptr;
    }

    SockPtr sockPtr = std::make_shared<Socket>(eps.front());

    try {
        sockPtr->listen();
    } catch(const char *err) {
        fatal(err);
    }

    std::shared_ptr<TcpServer> tcpServer =
        std::make_shared<TcpServer>(ploops_[0]);
    tcpServer->setServerSocket(sockPtr);

    tcpServer->start();

    return tcpServer;
}